

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sha256.cpp
# Opt level: O0

void Sha256::Private::Transform(UInt32 *state,UInt32 *data)

{
  UInt32 UVar1;
  uint uVar2;
  UInt32 UVar3;
  uint uVar4;
  UInt32 UVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  UInt32 UVar10;
  uint uVar11;
  uint uVar12;
  uint local_94;
  uint local_8c;
  UInt32 UStack_88;
  uint i;
  UInt32 T [8];
  uint local_5c;
  uint uStack_58;
  uint j;
  UInt32 W [16];
  UInt32 *data_local;
  UInt32 *state_local;
  
  W._56_8_ = data;
  for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
    (&UStack_88)[local_5c] = state[local_5c];
  }
  for (local_5c = 0; local_5c < 0x40; local_5c = local_5c + 0x10) {
    for (local_8c = 0; local_8c < 0x10; local_8c = local_8c + 1) {
      uVar12 = (&UStack_88)[4 - local_8c & 7];
      UVar1 = (&UStack_88)[4 - local_8c & 7];
      uVar2 = (&UStack_88)[4 - local_8c & 7];
      UVar3 = (&UStack_88)[4 - local_8c & 7];
      uVar4 = (&UStack_88)[4 - local_8c & 7];
      UVar5 = (&UStack_88)[4 - local_8c & 7];
      uVar6 = (&UStack_88)[6 - local_8c & 7];
      uVar7 = (&UStack_88)[4 - local_8c & 7];
      uVar8 = (&UStack_88)[5 - local_8c & 7];
      uVar9 = (&UStack_88)[6 - local_8c & 7];
      UVar10 = K[local_8c + local_5c];
      if (local_5c == 0) {
        local_94 = *(uint *)(W._56_8_ + (ulong)local_8c * 4);
        (&uStack_58)[local_8c] = local_94;
      }
      else {
        local_94 = (((&uStack_58)[local_8c - 2 & 0xf] >> 0x11 |
                    (&uStack_58)[local_8c - 2 & 0xf] << 0xf) ^
                    ((&uStack_58)[local_8c - 2 & 0xf] >> 0x13 |
                    (&uStack_58)[local_8c - 2 & 0xf] << 0xd) ^
                   (&uStack_58)[local_8c - 2 & 0xf] >> 10) + (&uStack_58)[local_8c - 7 & 0xf] +
                   (((&uStack_58)[local_8c - 0xf & 0xf] >> 7 |
                    (&uStack_58)[local_8c - 0xf & 0xf] << 0x19) ^
                    ((&uStack_58)[local_8c - 0xf & 0xf] >> 0x12 |
                    (&uStack_58)[local_8c - 0xf & 0xf] << 0xe) ^
                   (&uStack_58)[local_8c - 0xf & 0xf] >> 3) + (&uStack_58)[local_8c & 0xf];
        (&uStack_58)[local_8c & 0xf] = local_94;
      }
      uVar11 = 7 - local_8c & 7;
      (&UStack_88)[uVar11] =
           ((uVar12 >> 6 | UVar1 << 0x1a) ^ (uVar2 >> 0xb | UVar3 << 0x15) ^
           (uVar4 >> 0x19 | UVar5 << 7)) + (uVar6 ^ uVar7 & (uVar8 ^ uVar9)) + UVar10 + local_94 +
           (&UStack_88)[uVar11];
      uVar12 = 3 - local_8c & 7;
      (&UStack_88)[uVar12] = (&UStack_88)[7 - local_8c & 7] + (&UStack_88)[uVar12];
      uVar12 = 7 - local_8c & 7;
      (&UStack_88)[uVar12] =
           (((&UStack_88)[-local_8c & 7] >> 2 | (&UStack_88)[-local_8c & 7] << 0x1e) ^
            ((&UStack_88)[-local_8c & 7] >> 0xd | (&UStack_88)[-local_8c & 7] << 0x13) ^
           ((&UStack_88)[-local_8c & 7] >> 0x16 | (&UStack_88)[-local_8c & 7] << 10)) +
           ((&UStack_88)[-local_8c & 7] & (&UStack_88)[1 - local_8c & 7] |
           (&UStack_88)[2 - local_8c & 7] &
           ((&UStack_88)[-local_8c & 7] | (&UStack_88)[1 - local_8c & 7])) + (&UStack_88)[uVar12];
    }
  }
  for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
    state[local_5c] = (&UStack_88)[local_5c] + state[local_5c];
  }
  return;
}

Assistant:

static void Transform(UInt32 *state, const UInt32 *data)
  {
    UInt32 W[16];
    unsigned j;
    #ifdef _SHA256_UNROLL2
    UInt32 a,b,c,d,e,f,g,h;
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];
    f = state[5];
    g = state[6];
    h = state[7];
    #else
    UInt32 T[8];
    for (j = 0; j < 8; j++)
      T[j] = state[j];
    #endif

    for (j = 0; j < 64; j += 16)
    {
      #if defined(_SHA256_UNROLL) || defined(_SHA256_UNROLL2)
      RX_8(0); RX_8(8);
      #else
      unsigned i;
      for (i = 0; i < 16; i++) { R(i); }
      #endif
    }

    #ifdef _SHA256_UNROLL2
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
    state[5] += f;
    state[6] += g;
    state[7] += h;
    #else
    for (j = 0; j < 8; j++)
      state[j] += T[j];
    #endif
  
    /* Wipe variables */
    /* memset(W, 0, sizeof(W)); */
    /* memset(T, 0, sizeof(T)); */
  }